

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::InputFile::Data::lockedSetFrameBuffer(Data *this,FrameBuffer *frameBuffer)

{
  FrameBuffer *this_00;
  _Base_ptr fv;
  _Rb_tree_color t;
  FrameBuffer *this_01;
  CompositeDeepScanLine *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  ConstIterator CVar8;
  CompositeDeepScanLine *pCVar9;
  ostream *poVar10;
  char *pcVar11;
  ArgExc *this_02;
  int iVar12;
  undefined1 in_R10B;
  ulong __n;
  sbyte sVar13;
  exr_attr_box2i_t eVar14;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  if (this->_storage - EXR_STORAGE_DEEP_SCANLINE < 2) {
    pCVar9 = (this->_compositor)._M_t.
             super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
             ._M_t.
             super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
             .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
    if (pCVar9 == (CompositeDeepScanLine *)0x0) {
      std::make_unique<Imf_3_4::CompositeDeepScanLine>();
      pCVar1 = __iex_throw_s;
      __iex_throw_s = (CompositeDeepScanLine *)0x0;
      pCVar9 = (this->_compositor)._M_t.
               super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
      (this->_compositor)._M_t.
      super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      ._M_t.
      super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl = pCVar1;
      if ((pCVar9 != (CompositeDeepScanLine *)0x0) &&
         ((*pCVar9->_vptr_CompositeDeepScanLine[1])(), __iex_throw_s != (CompositeDeepScanLine *)0x0
         )) {
        (*__iex_throw_s->_vptr_CompositeDeepScanLine[1])();
      }
      pCVar9 = (this->_compositor)._M_t.
               super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
    }
    CompositeDeepScanLine::setFrameBuffer(pCVar9,frameBuffer);
    return;
  }
  if (this->_storage == EXR_STORAGE_TILED) {
    this_00 = &this->_cacheFrameBuffer;
    cVar6._M_node = (_Base_ptr)FrameBuffer::begin(this_00);
    for (cVar7._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
        (((CVar8 = FrameBuffer::end(this_00), (const_iterator)cVar6._M_node != CVar8._i._M_node &&
          (CVar8 = FrameBuffer::end(frameBuffer), (const_iterator)cVar7._M_node != CVar8._i._M_node)
          ) && (iVar3 = strcmp((char *)(cVar6._M_node + 1),(char *)(cVar7._M_node + 1)), iVar3 == 0)
         ) && (cVar6._M_node[9]._M_color == cVar7._M_node[9]._M_color));
        cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node)) {
      cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
    }
    CVar8 = FrameBuffer::end(this_00);
    if (((const_iterator)cVar6._M_node != CVar8._i._M_node) ||
       (CVar8 = FrameBuffer::end(frameBuffer), (const_iterator)cVar7._M_node != CVar8._i._M_node)) {
      deleteCachedBuffer(this);
      std::make_unique<Imf_3_4::FrameBuffer>();
      pCVar9 = __iex_throw_s;
      __iex_throw_s = (CompositeDeepScanLine *)0x0;
      std::__uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::reset
                ((__uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                  *)&this->_cachedBuffer,(pointer)pCVar9);
      std::unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>::~unique_ptr
                ((unique_ptr<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_> *)
                 &_iex_throw_s);
      iVar12 = 0;
      iVar3 = 0;
      if (this->_part != (InputPartData *)0x0) {
        iVar3 = this->_part->partNumber;
      }
      eVar14 = Context::dataWindow(this->_ctxt,iVar3);
      this->_cachedOffset = eVar14.min.x;
      uVar4 = TiledInputFile::tileYSize
                        ((this->_tFile)._M_t.
                         super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                         .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl);
      if (this->_part != (InputPartData *)0x0) {
        iVar12 = this->_part->partNumber;
      }
      bVar2 = Context::chunkTableValid(this->_ctxt,iVar12);
      if (!bVar2) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_1a8,
                                  "Unable to use generic API to read with (partially?) corrupt chunk table in "
                                 );
        pcVar11 = Context::fileName(this->_ctxt);
        poVar10 = std::operator<<(poVar10,pcVar11);
        poVar10 = std::operator<<(poVar10,", part ");
        iVar3 = 0;
        if (this->_part != (InputPartData *)0x0) {
          iVar3 = this->_part->partNumber;
        }
        std::ostream::operator<<((ostream *)poVar10,iVar3);
        this_02 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_02,(stringstream *)&_iex_throw_s);
        __cxa_throw(this_02,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      cVar6._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
      for (; CVar8 = FrameBuffer::end(frameBuffer),
          (const_iterator)cVar6._M_node != CVar8._i._M_node;
          cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node)) {
        t = cVar6._M_node[9]._M_color;
        fv = cVar6._M_node[10]._M_parent;
        bVar2 = Context::hasChannel(this->_ctxt,iVar3,(char *)(cVar6._M_node + 1));
        if (bVar2) {
          iVar12 = this->_cachedOffset;
          sVar13 = (t != _S_black) + 1;
          __n = (((long)eVar14.max.x - (long)eVar14.min.x) + 1) * (ulong)uVar4 << sVar13;
          pCVar9 = (CompositeDeepScanLine *)operator_new__(__n);
          memset(pCVar9,0,__n);
          __iex_throw_s = pCVar9;
          std::
          vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
          ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                    ((vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
                      *)&this->_slicePointers,
                     (unique_ptr<char[],_std::default_delete<char[]>_> *)&_iex_throw_s);
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)&_iex_throw_s);
          this_01 = (this->_cachedBuffer)._M_t.
                    super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                    .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl;
          pcVar11 = (this->_slicePointers).
                    super__Vector_base<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                    super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl;
          iVar5 = TiledInputFile::levelWidth
                            ((this->_tFile)._M_t.
                             super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                             .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl,0
                            );
          Slice::Slice((Slice *)&_iex_throw_s,t,pcVar11 + -((long)iVar12 << sVar13),
                       (ulong)(t != _S_black) * 2 + 2,(long)iVar5 << sVar13,1,1,(double)fv,
                       (bool)in_R10B,SUB41(iVar5,0));
          FrameBuffer::insert(this_01,(char *)(cVar6._M_node + 1),(Slice *)&_iex_throw_s);
        }
      }
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)this_00,
                (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)frameBuffer);
    return;
  }
  ScanLineInputFile::setFrameBuffer
            ((this->_sFile)._M_t.
             super___uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
             .super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl,frameBuffer);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&this->_cacheFrameBuffer,
              (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)frameBuffer);
  return;
}

Assistant:

void
InputFile::Data::lockedSetFrameBuffer (const FrameBuffer& frameBuffer)
{
    if (_storage == EXR_STORAGE_TILED)
    {
        //
        // We must invalidate the cached buffer if the new frame
        // buffer has a different set of channels than the old
        // frame buffer, or if the type of a channel has changed.
        //

        const FrameBuffer& oldFrameBuffer = _cacheFrameBuffer;

        FrameBuffer::ConstIterator i = oldFrameBuffer.begin ();
        FrameBuffer::ConstIterator j = frameBuffer.begin ();

        while (i != oldFrameBuffer.end () && j != frameBuffer.end ())
        {
            if (strcmp (i.name (), j.name ()) ||
                i.slice ().type != j.slice ().type)
                break;

            ++i;
            ++j;
        }

        if (i != oldFrameBuffer.end () || j != frameBuffer.end ())
        {
            //
            // Invalidate the cached buffer.
            //
            deleteCachedBuffer ();

            //
            // Create new a cached frame buffer.  It can hold a single
            // row of tiles.  The cached buffer can be reused for each
            // row of tiles because we set the yTileCoords parameter of
            // each Slice to true.
            //

            _cachedBuffer               = std::make_unique<FrameBuffer> ();
            int              partidx    = getPartIdx ();
            exr_attr_box2i_t dataWindow = _ctxt->dataWindow (partidx);
            _cachedOffset               = dataWindow.min.x;

            uint64_t tileRowSize =
                static_cast<uint64_t> (_tFile->tileYSize ()) *
                static_cast<uint64_t> (
                    static_cast<int64_t> (dataWindow.max.x) -
                    static_cast<int64_t> (dataWindow.min.x) +
                    1LL );

            // before we allocate a (potentially large) chunk of ram, let's
            // quick ensure we can read the tiles
            if (!_ctxt->chunkTableValid (getPartIdx ()))
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Unable to use generic API to read with (partially?) corrupt chunk table in "
                    << _ctxt->fileName () << ", part " << getPartIdx () );
            }

            for (FrameBuffer::ConstIterator k = frameBuffer.begin ();
                 k != frameBuffer.end ();
                 ++k)
            {
                Slice s = k.slice ();

                //
                // omit adding channels that are not listed - 'fill' channels are added later
                //
                if (_ctxt->hasChannel (partidx, k.name ()))
                {
                    uint64_t bytes = (s.type == OPENEXR_IMF_INTERNAL_NAMESPACE::HALF) ? 2 : 4;
                    uint64_t offset = bytes * _cachedOffset;
                    uint64_t tilebytes = bytes * tileRowSize;

                    _slicePointers.emplace_back (std::make_unique<char[]> (tilebytes));

                    _cachedBuffer->insert (
                        k.name (),
                        Slice (
                            s.type,
                            _slicePointers.back ().get() - offset,
                            bytes,
                            bytes * _tFile->levelWidth (0),
                            1,
                            1,
                            s.fillValue,
                            false,
                            true));
                }
            }
        }

        _cacheFrameBuffer = frameBuffer;
    }
    else if (
        _storage == EXR_STORAGE_DEEP_SCANLINE ||
        _storage == EXR_STORAGE_DEEP_TILED)
    {
        if (!_compositor)
            _compositor = std::make_unique<CompositeDeepScanLine> ();
        _compositor->setFrameBuffer (frameBuffer);
    }
    else
    {
        _sFile->setFrameBuffer (frameBuffer);
        _cacheFrameBuffer = frameBuffer;
    }
}